

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfUtil.c
# Opt level: O2

Vec_Int_t * Cnf_DataCollectCoSatNums(Cnf_Dat_t *pCnf,Aig_Man_t *p)

{
  Vec_Int_t *p_00;
  void *pvVar1;
  int i;
  
  p_00 = Vec_IntAlloc(p->nObjs[3]);
  for (i = 0; i < p->vCos->nSize; i = i + 1) {
    pvVar1 = Vec_PtrEntry(p->vCos,i);
    Vec_IntPush(p_00,pCnf->pVarNums[*(int *)((long)pvVar1 + 0x24)]);
  }
  return p_00;
}

Assistant:

Vec_Int_t * Cnf_DataCollectCoSatNums( Cnf_Dat_t * pCnf, Aig_Man_t * p )
{
    Vec_Int_t * vCoIds;
    Aig_Obj_t * pObj;
    int i;
    vCoIds = Vec_IntAlloc( Aig_ManCoNum(p) );
    Aig_ManForEachCo( p, pObj, i )
        Vec_IntPush( vCoIds, pCnf->pVarNums[pObj->Id] );
    return vCoIds;
}